

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.h
# Opt level: O1

void __thiscall dg::pta::PointerGraph::PointerGraph(PointerGraph *this)

{
  NodesT *this_00;
  _Rb_tree_header *p_Var1;
  pointer *ppuVar2;
  iterator iVar3;
  void *local_18;
  
  this->dfsnum = 0;
  this_00 = &this->nodes;
  this->_entry = (PointerSubgraph *)0x0;
  (this->nodes).
  super__Vector_base<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodes).
  super__Vector_base<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nodes).
  super__Vector_base<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_subgraphs).
  super__Vector_base<std::unique_ptr<dg::pta::PointerSubgraph,_std::default_delete<dg::pta::PointerSubgraph>_>,_std::allocator<std::unique_ptr<dg::pta::PointerSubgraph,_std::default_delete<dg::pta::PointerSubgraph>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_subgraphs).
  super__Vector_base<std::unique_ptr<dg::pta::PointerSubgraph,_std::default_delete<dg::pta::PointerSubgraph>_>,_std::allocator<std::unique_ptr<dg::pta::PointerSubgraph,_std::default_delete<dg::pta::PointerSubgraph>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_subgraphs).
  super__Vector_base<std::unique_ptr<dg::pta::PointerSubgraph,_std::default_delete<dg::pta::PointerSubgraph>_>,_std::allocator<std::unique_ptr<dg::pta::PointerSubgraph,_std::default_delete<dg::pta::PointerSubgraph>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->last_node_id = 3;
  (this->callGraph).last_id = 0;
  p_Var1 = &(this->callGraph)._mapping._M_t._M_impl.super__Rb_tree_header;
  (this->callGraph)._mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->callGraph)._mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->callGraph)._mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->callGraph)._mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->callGraph)._mapping._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_globals).super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_globals).super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_globals).super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_18 = (void *)0x0;
  iVar3._M_current =
       (this->nodes).
       super__Vector_base<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this->nodes).
      super__Vector_base<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>,std::allocator<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>>>
    ::_M_realloc_insert<decltype(nullptr)>
              ((vector<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>,std::allocator<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>>>
                *)this_00,iVar3,&local_18);
  }
  else {
    ((iVar3._M_current)->_M_t).
    super___uniq_ptr_impl<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>._M_t.
    super__Tuple_impl<0UL,_dg::pta::PSNode_*,_std::default_delete<dg::pta::PSNode>_>.
    super__Head_base<0UL,_dg::pta::PSNode_*,_false>._M_head_impl = (PSNode *)0x0;
    ppuVar2 = &(this->nodes).
               super__Vector_base<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppuVar2 = *ppuVar2 + 1;
  }
  local_18 = (void *)0x0;
  iVar3._M_current =
       (this->nodes).
       super__Vector_base<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this->nodes).
      super__Vector_base<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>,std::allocator<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>>>
    ::_M_realloc_insert<decltype(nullptr)>
              ((vector<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>,std::allocator<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>>>
                *)this_00,iVar3,&local_18);
  }
  else {
    ((iVar3._M_current)->_M_t).
    super___uniq_ptr_impl<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>._M_t.
    super__Tuple_impl<0UL,_dg::pta::PSNode_*,_std::default_delete<dg::pta::PSNode>_>.
    super__Head_base<0UL,_dg::pta::PSNode_*,_false>._M_head_impl = (PSNode *)0x0;
    ppuVar2 = &(this->nodes).
               super__Vector_base<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppuVar2 = *ppuVar2 + 1;
  }
  local_18 = (void *)0x0;
  iVar3._M_current =
       (this->nodes).
       super__Vector_base<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this->nodes).
      super__Vector_base<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>,std::allocator<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>>>
    ::_M_realloc_insert<decltype(nullptr)>
              ((vector<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>,std::allocator<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>>>
                *)this_00,iVar3,&local_18);
  }
  else {
    ((iVar3._M_current)->_M_t).
    super___uniq_ptr_impl<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>._M_t.
    super__Tuple_impl<0UL,_dg::pta::PSNode_*,_std::default_delete<dg::pta::PSNode>_>.
    super__Head_base<0UL,_dg::pta::PSNode_*,_false>._M_head_impl = (PSNode *)0x0;
    ppuVar2 = &(this->nodes).
               super__Vector_base<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppuVar2 = *ppuVar2 + 1;
  }
  local_18 = (void *)0x0;
  iVar3._M_current =
       (this->nodes).
       super__Vector_base<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this->nodes).
      super__Vector_base<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>,std::allocator<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>>>
    ::_M_realloc_insert<decltype(nullptr)>
              ((vector<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>,std::allocator<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>>>
                *)this_00,iVar3,&local_18);
  }
  else {
    ((iVar3._M_current)->_M_t).
    super___uniq_ptr_impl<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>._M_t.
    super__Tuple_impl<0UL,_dg::pta::PSNode_*,_std::default_delete<dg::pta::PSNode>_>.
    super__Head_base<0UL,_dg::pta::PSNode_*,_false>._M_head_impl = (PSNode *)0x0;
    ppuVar2 = &(this->nodes).
               super__Vector_base<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppuVar2 = *ppuVar2 + 1;
  }
  dg::pta::PointerGraph::initStaticNodes();
  return;
}

Assistant:

PointerGraph() {
        // nodes[0] represents invalid node (the node with id 0)
        nodes.emplace_back(nullptr);
        // the first several nodes are special nodes. For now, we just replace
        // them with nullptr, as those are created statically <-- FIXME!
        nodes.emplace_back(nullptr);
        nodes.emplace_back(nullptr);
        nodes.emplace_back(nullptr);
        assert(nodes.size() - 1 == PointerGraphReservedIDs::LAST_RESERVED_ID);
        initStaticNodes();
    }